

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

int Cba_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  int local_40;
  int local_3c;
  int iLit_2;
  int k_2;
  int iLit_1;
  int k_1;
  int iLit;
  int k;
  int Type_local;
  int nFans_local;
  int *pFans_local;
  Gia_Man_t *pNew_local;
  
  if (Type == 0x1b) {
    iLit_1 = 1;
    for (k_1 = 0; k_1 < nFans; k_1 = k_1 + 1) {
      iLit_1 = Gia_ManHashAnd(pNew,iLit_1,pFans[k_1]);
    }
    pNew_local._4_4_ = iLit_1;
  }
  else if (Type == 0x1d) {
    iLit_2 = 0;
    for (k_2 = 0; k_2 < nFans; k_2 = k_2 + 1) {
      iLit_2 = Gia_ManHashOr(pNew,iLit_2,pFans[k_2]);
    }
    pNew_local._4_4_ = iLit_2;
  }
  else {
    if (Type != 0x1f) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                    ,0xf7,"int Cba_BlastReduction(Gia_Man_t *, int *, int, int)");
    }
    local_40 = 0;
    for (local_3c = 0; local_3c < nFans; local_3c = local_3c + 1) {
      local_40 = Gia_ManHashXor(pNew,local_40,pFans[local_3c]);
    }
    pNew_local._4_4_ = local_40;
  }
  return pNew_local._4_4_;
}

Assistant:

int Cba_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == CBA_BOX_RAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_ROR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return iLit;
    }
    if ( Type == CBA_BOX_RXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return iLit;
    }
    assert( 0 );
    return -1;
}